

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sha.c
# Opt level: O0

int ndn_sha256_sign(uint8_t *input_value,uint32_t input_size,uint8_t *output_value,
                   uint32_t output_max_size,uint32_t *output_used_size)

{
  int iVar1;
  uint32_t *output_used_size_local;
  uint32_t output_max_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (output_max_size < 0x20) {
    input_value_local._4_4_ = -10;
  }
  else {
    iVar1 = ndn_sha256(input_value,input_size,output_value);
    if (iVar1 == 0) {
      *output_used_size = 0x20;
      input_value_local._4_4_ = 0;
    }
    else {
      input_value_local._4_4_ = 0x20;
    }
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_sha256_sign(const uint8_t* input_value, uint32_t input_size,
                uint8_t* output_value, uint32_t output_max_size,
                uint32_t* output_used_size)
{
  if (output_max_size < NDN_SEC_SHA256_HASH_SIZE)
    return NDN_OVERSIZE;
  if (ndn_sha256(input_value, input_size, output_value) != NDN_SUCCESS) {
    return NDN_SEC_SHA256_HASH_SIZE;
  }
  *output_used_size = NDN_SEC_SHA256_HASH_SIZE;
  return NDN_SUCCESS;
}